

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.cpp
# Opt level: O2

optional<pbrt::ShapeIntersection> * __thiscall
pbrt::Triangle::Intersect
          (optional<pbrt::ShapeIntersection> *__return_storage_ptr__,Triangle *this,Ray *ray,
          Float tMax)

{
  Float time;
  int triIndex;
  TriangleMesh *mesh;
  int *piVar1;
  Point3f *pPVar2;
  TriangleIntersection *pTVar3;
  long lVar4;
  long in_FS_OFFSET;
  undefined1 auVar6 [56];
  undefined1 auVar5 [64];
  Vector3<float> VVar7;
  optional<pbrt::TriangleIntersection> triIsect;
  Point3f p2;
  Point3f p1;
  Point3f p0;
  SurfaceInteraction intr;
  optional<pbrt::TriangleIntersection> local_26c;
  Tuple3<pbrt::Point3,_float> local_258;
  Tuple3<pbrt::Point3,_float> local_248;
  Tuple3<pbrt::Point3,_float> local_238;
  ShapeIntersection local_228;
  SurfaceInteraction local_128;
  
  lVar4 = allMeshes;
  *(long *)(in_FS_OFFSET + -0x678) = *(long *)(in_FS_OFFSET + -0x678) + 1;
  mesh = *(TriangleMesh **)(*(long *)(lVar4 + 8) + (long)this->meshIndex * 8);
  lVar4 = (long)this->triIndex;
  piVar1 = mesh->vertexIndices;
  pPVar2 = mesh->p;
  local_238.z = pPVar2[piVar1[lVar4 * 3]].super_Tuple3<pbrt::Point3,_float>.z;
  local_238.x = pPVar2[piVar1[lVar4 * 3]].super_Tuple3<pbrt::Point3,_float>.x;
  local_238.y = pPVar2[piVar1[lVar4 * 3]].super_Tuple3<pbrt::Point3,_float>.y;
  local_248.z = pPVar2[piVar1[lVar4 * 3 + 1]].super_Tuple3<pbrt::Point3,_float>.z;
  local_248.x = pPVar2[piVar1[lVar4 * 3 + 1]].super_Tuple3<pbrt::Point3,_float>.x;
  local_248.y = pPVar2[piVar1[lVar4 * 3 + 1]].super_Tuple3<pbrt::Point3,_float>.y;
  local_258.z = pPVar2[piVar1[lVar4 * 3 + 2]].super_Tuple3<pbrt::Point3,_float>.z;
  local_258.x = pPVar2[piVar1[lVar4 * 3 + 2]].super_Tuple3<pbrt::Point3,_float>.x;
  local_258.y = pPVar2[piVar1[lVar4 * 3 + 2]].super_Tuple3<pbrt::Point3,_float>.y;
  IntersectTriangle(&local_26c,ray,tMax,(Point3f *)&local_238,(Point3f *)&local_248,
                    (Point3f *)&local_258);
  if (local_26c.set == false) {
    *(undefined8 *)&__return_storage_ptr__->set = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xc0) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 200) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xd0) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xd8) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xe0) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xe8) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xf0) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xf8) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x80) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x88) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x90) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x98) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xa0) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xa8) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xb0) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xb8) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x40) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x48) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x50) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x58) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x60) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x68) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x70) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x78) = 0;
    (__return_storage_ptr__->optionalValue).__align = (anon_struct_8_0_00000001_for___align)0x0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 8) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x10) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x18) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x20) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x28) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x30) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x38) = 0;
  }
  else {
    triIndex = this->triIndex;
    pTVar3 = pstd::optional<pbrt::TriangleIntersection>::value(&local_26c);
    time = ray->time;
    auVar6 = (undefined1  [56])0x0;
    VVar7 = Tuple3<pbrt::Vector3,_float>::operator-(&(ray->d).super_Tuple3<pbrt::Vector3,_float>);
    auVar5._0_8_ = VVar7.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar5._8_56_ = auVar6;
    local_228.intr.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
    super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x =
         (Interval<float>)vmovlps_avx(auVar5._0_16_);
    local_228.intr.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
    super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.low =
         VVar7.super_Tuple3<pbrt::Vector3,_float>.z;
    InteractionFromIntersection(&local_128,mesh,triIndex,pTVar3,time,(Vector3f *)&local_228);
    *(long *)(in_FS_OFFSET + -0x670) = *(long *)(in_FS_OFFSET + -0x670) + 1;
    local_228.intr.super_Interaction.mediumInterface = local_128.super_Interaction.mediumInterface;
    local_228.intr.super_Interaction.medium.
    super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
    .bits = local_128.super_Interaction.medium.
            super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
            .bits;
    local_228.intr.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
    super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x =
         local_128.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
         super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x;
    local_228.intr.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
    super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y =
         local_128.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
         super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y;
    local_228.intr.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
    super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z =
         local_128.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
         super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z;
    local_228.intr.super_Interaction.time = local_128.super_Interaction.time;
    local_228.intr.super_Interaction.wo.super_Tuple3<pbrt::Vector3,_float>.x =
         local_128.super_Interaction.wo.super_Tuple3<pbrt::Vector3,_float>.x;
    local_228.intr.super_Interaction.wo.super_Tuple3<pbrt::Vector3,_float>.y =
         local_128.super_Interaction.wo.super_Tuple3<pbrt::Vector3,_float>.y;
    local_228.intr.super_Interaction.wo.super_Tuple3<pbrt::Vector3,_float>.z =
         local_128.super_Interaction.wo.super_Tuple3<pbrt::Vector3,_float>.z;
    local_228.intr.super_Interaction.n.super_Tuple3<pbrt::Normal3,_float>.x =
         local_128.super_Interaction.n.super_Tuple3<pbrt::Normal3,_float>.x;
    local_228.intr.super_Interaction.n.super_Tuple3<pbrt::Normal3,_float>.y =
         local_128.super_Interaction.n.super_Tuple3<pbrt::Normal3,_float>.y;
    local_228.intr.super_Interaction.n.super_Tuple3<pbrt::Normal3,_float>.z =
         local_128.super_Interaction.n.super_Tuple3<pbrt::Normal3,_float>.z;
    local_228.intr.super_Interaction.uv.super_Tuple2<pbrt::Point2,_float>.x =
         local_128.super_Interaction.uv.super_Tuple2<pbrt::Point2,_float>.x;
    local_228.intr.super_Interaction.uv.super_Tuple2<pbrt::Point2,_float>.y =
         local_128.super_Interaction.uv.super_Tuple2<pbrt::Point2,_float>.y;
    local_228.intr.super_Interaction._60_4_ = local_128.super_Interaction._60_4_;
    local_228.intr.dpdu.super_Tuple3<pbrt::Vector3,_float>.x =
         local_128.dpdu.super_Tuple3<pbrt::Vector3,_float>.x;
    local_228.intr.dpdu.super_Tuple3<pbrt::Vector3,_float>.y =
         local_128.dpdu.super_Tuple3<pbrt::Vector3,_float>.y;
    local_228.intr.dpdu.super_Tuple3<pbrt::Vector3,_float>.z =
         local_128.dpdu.super_Tuple3<pbrt::Vector3,_float>.z;
    local_228.intr.dpdv.super_Tuple3<pbrt::Vector3,_float>.x =
         local_128.dpdv.super_Tuple3<pbrt::Vector3,_float>.x;
    local_228.intr.dpdv.super_Tuple3<pbrt::Vector3,_float>.y =
         local_128.dpdv.super_Tuple3<pbrt::Vector3,_float>.y;
    local_228.intr.dpdv.super_Tuple3<pbrt::Vector3,_float>.z =
         local_128.dpdv.super_Tuple3<pbrt::Vector3,_float>.z;
    local_228.intr.dndu.super_Tuple3<pbrt::Normal3,_float>.x =
         local_128.dndu.super_Tuple3<pbrt::Normal3,_float>.x;
    local_228.intr.dndu.super_Tuple3<pbrt::Normal3,_float>.y =
         local_128.dndu.super_Tuple3<pbrt::Normal3,_float>.y;
    local_228.intr.dndu.super_Tuple3<pbrt::Normal3,_float>.z =
         local_128.dndu.super_Tuple3<pbrt::Normal3,_float>.z;
    local_228.intr.dndv.super_Tuple3<pbrt::Normal3,_float>.x =
         local_128.dndv.super_Tuple3<pbrt::Normal3,_float>.x;
    local_228.intr.dndv.super_Tuple3<pbrt::Normal3,_float>.y =
         local_128.dndv.super_Tuple3<pbrt::Normal3,_float>.y;
    local_228.intr.dndv.super_Tuple3<pbrt::Normal3,_float>.z =
         local_128.dndv.super_Tuple3<pbrt::Normal3,_float>.z;
    local_228.intr.shading.n.super_Tuple3<pbrt::Normal3,_float>.x =
         local_128.shading.n.super_Tuple3<pbrt::Normal3,_float>.x;
    local_228.intr.shading.n.super_Tuple3<pbrt::Normal3,_float>.y =
         local_128.shading.n.super_Tuple3<pbrt::Normal3,_float>.y;
    local_228.intr.shading.n.super_Tuple3<pbrt::Normal3,_float>.z =
         local_128.shading.n.super_Tuple3<pbrt::Normal3,_float>.z;
    local_228.intr.shading.dpdu.super_Tuple3<pbrt::Vector3,_float>.x =
         local_128.shading.dpdu.super_Tuple3<pbrt::Vector3,_float>.x;
    local_228.intr.shading.dpdu.super_Tuple3<pbrt::Vector3,_float>.y =
         local_128.shading.dpdu.super_Tuple3<pbrt::Vector3,_float>.y;
    local_228.intr.shading.dpdu.super_Tuple3<pbrt::Vector3,_float>.z =
         local_128.shading.dpdu.super_Tuple3<pbrt::Vector3,_float>.z;
    local_228.intr.shading.dpdv.super_Tuple3<pbrt::Vector3,_float>.x =
         local_128.shading.dpdv.super_Tuple3<pbrt::Vector3,_float>.x;
    local_228.intr.shading.dpdv.super_Tuple3<pbrt::Vector3,_float>.y =
         local_128.shading.dpdv.super_Tuple3<pbrt::Vector3,_float>.y;
    local_228.intr.shading.dpdv.super_Tuple3<pbrt::Vector3,_float>.z =
         local_128.shading.dpdv.super_Tuple3<pbrt::Vector3,_float>.z;
    local_228.intr.shading.dndu.super_Tuple3<pbrt::Normal3,_float>.x =
         local_128.shading.dndu.super_Tuple3<pbrt::Normal3,_float>.x;
    local_228.intr.shading.dndu.super_Tuple3<pbrt::Normal3,_float>.y =
         local_128.shading.dndu.super_Tuple3<pbrt::Normal3,_float>.y;
    local_228.intr.shading.dndu.super_Tuple3<pbrt::Normal3,_float>.z =
         local_128.shading.dndu.super_Tuple3<pbrt::Normal3,_float>.z;
    local_228.intr.shading.dndv.super_Tuple3<pbrt::Normal3,_float>.x =
         local_128.shading.dndv.super_Tuple3<pbrt::Normal3,_float>.x;
    local_228.intr.shading.dndv.super_Tuple3<pbrt::Normal3,_float>.y =
         local_128.shading.dndv.super_Tuple3<pbrt::Normal3,_float>.y;
    local_228.intr.shading.dndv.super_Tuple3<pbrt::Normal3,_float>.z =
         local_128.shading.dndv.super_Tuple3<pbrt::Normal3,_float>.z;
    local_228.intr.faceIndex = local_128.faceIndex;
    local_228.intr.material.
    super_TaggedPointer<pbrt::CoatedDiffuseMaterial,_pbrt::CoatedConductorMaterial,_pbrt::ConductorMaterial,_pbrt::DielectricMaterial,_pbrt::DiffuseMaterial,_pbrt::DiffuseTransmissionMaterial,_pbrt::HairMaterial,_pbrt::MeasuredMaterial,_pbrt::SubsurfaceMaterial,_pbrt::ThinDielectricMaterial,_pbrt::MixMaterial>
    .bits = local_128.material.
            super_TaggedPointer<pbrt::CoatedDiffuseMaterial,_pbrt::CoatedConductorMaterial,_pbrt::ConductorMaterial,_pbrt::DielectricMaterial,_pbrt::DiffuseMaterial,_pbrt::DiffuseTransmissionMaterial,_pbrt::HairMaterial,_pbrt::MeasuredMaterial,_pbrt::SubsurfaceMaterial,_pbrt::ThinDielectricMaterial,_pbrt::MixMaterial>
            .bits;
    local_228.intr.areaLight.
    super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
    .bits = local_128.areaLight.
            super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
            .bits;
    local_228.intr.dudy = local_128.dudy;
    local_228.intr.dvdy = local_128.dvdy;
    local_228.intr.dpdx.super_Tuple3<pbrt::Vector3,_float>.x =
         local_128.dpdx.super_Tuple3<pbrt::Vector3,_float>.x;
    local_228.intr.dpdx.super_Tuple3<pbrt::Vector3,_float>.y =
         local_128.dpdx.super_Tuple3<pbrt::Vector3,_float>.y;
    local_228.intr.dpdx.super_Tuple3<pbrt::Vector3,_float>.z =
         local_128.dpdx.super_Tuple3<pbrt::Vector3,_float>.z;
    local_228.intr.dpdy.super_Tuple3<pbrt::Vector3,_float>.x =
         local_128.dpdy.super_Tuple3<pbrt::Vector3,_float>.x;
    local_228.intr.dpdy.super_Tuple3<pbrt::Vector3,_float>.y =
         local_128.dpdy.super_Tuple3<pbrt::Vector3,_float>.y;
    local_228.intr.dpdy.super_Tuple3<pbrt::Vector3,_float>.z =
         local_128.dpdy.super_Tuple3<pbrt::Vector3,_float>.z;
    local_228.intr.dudx = local_128.dudx;
    local_228.intr.dvdx = local_128.dvdx;
    pTVar3 = pstd::optional<pbrt::TriangleIntersection>::value(&local_26c);
    local_228.tHit = pTVar3->t;
    pstd::optional<pbrt::ShapeIntersection>::optional(__return_storage_ptr__,&local_228);
  }
  pstd::optional<pbrt::TriangleIntersection>::~optional(&local_26c);
  return __return_storage_ptr__;
}

Assistant:

pstd::optional<ShapeIntersection> Triangle::Intersect(const Ray &ray, Float tMax) const {
#ifndef PBRT_IS_GPU_CODE
    ++nTriTests;
#endif
    // Get triangle vertices in _p0_, _p1_, and _p2_
    const TriangleMesh *mesh = GetMesh();
    const int *v = &mesh->vertexIndices[3 * triIndex];
    Point3f p0 = mesh->p[v[0]], p1 = mesh->p[v[1]], p2 = mesh->p[v[2]];

    pstd::optional<TriangleIntersection> triIsect =
        IntersectTriangle(ray, tMax, p0, p1, p2);
    if (!triIsect)
        return {};

    SurfaceInteraction intr =
        InteractionFromIntersection(mesh, triIndex, *triIsect, ray.time, -ray.d);
#ifndef PBRT_IS_GPU_CODE
    ++nTriHits;
#endif
    return ShapeIntersection{intr, triIsect->t};
}